

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O0

wchar_t borg_launch_bolt_aux_hack(wchar_t i,wchar_t dam,wchar_t typ,wchar_t ammo_location)

{
  ushort uVar1;
  monster_race *pmVar2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_kill *pbVar5;
  borg_grid *pbVar6;
  monster_race *r_ptr;
  borg_kill *kill;
  borg_grid *ag;
  wchar_t unknown;
  wchar_t walls;
  wchar_t o_x;
  wchar_t o_y;
  wchar_t y;
  wchar_t x;
  wchar_t p1;
  wchar_t p2;
  wchar_t d;
  wchar_t ammo_location_local;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t i_local;
  
  pmVar2 = r_info;
  ag._4_4_ = 0;
  ag._0_4_ = 0;
  pbVar5 = borg_kills + i;
  uVar1 = pbVar5->r_idx;
  if (pbVar5->r_idx == 0) {
    dam_local = L'\0';
  }
  else if ((int)(uint)pbVar5->r_idx < (int)(z_info->r_max - 1)) {
    if ((int)pbVar5->when < borg_t + -2) {
      dam_local = L'\0';
    }
    else {
      o_y = (pbVar5->pos).x;
      o_x = (pbVar5->pos).y;
      pbVar6 = borg_grids[o_x] + o_y;
      _Var3 = borg_cave_floor_grid(pbVar6);
      if (_Var3) {
        _Var3 = flag_has_dbg(pmVar2[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
        if ((((_Var3) && (pbVar6->feat != '\x01')) && (pbVar6->feat != '\x03')) &&
           ((pbVar6->feat != '\x04' && ((pbVar6->trap & 1U) == 0)))) {
          dam_local = L'\0';
        }
        else {
          _Var3 = flag_has_dbg(pmVar2[uVar1].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if (_Var3) {
            o_y = (pbVar5->pos).x;
            o_x = (pbVar5->pos).y;
            for (unknown = L'\xffffffff'; unknown < L'\x02'; unknown = unknown + L'\x01') {
              for (walls = L'\xffffffff'; walls < L'\x02'; walls = walls + L'\x01') {
                o_y = (pbVar5->pos).x + unknown;
                o_x = (pbVar5->pos).y + walls;
                pbVar6 = borg_grids[o_x] + o_y;
                if ((0x10 < pbVar6->feat) && (pbVar6->feat < 0x17)) {
                  ag._4_4_ = ag._4_4_ + 1;
                }
                if (pbVar6->feat == '\0') {
                  ag._0_4_ = (int)ag + 1;
                }
              }
            }
            if ((1 < ag._4_4_) && (0 < (int)ag)) {
              return L'\0';
            }
          }
          p1 = borg_launch_damage_one(i,dam,typ,ammo_location);
          dam_local = p1;
          if ((((typ != L'-') && (typ != L'.')) && (typ != L'6')) && (L'\0' < p1)) {
            wVar4 = borg_danger_one_kill(o_x,o_y,L'\x01',i,true,false);
            if ((((pbVar5->awake & 1U) == 0) && ((int)avoidance / 2 < wVar4)) &&
               ((p1 < pbVar5->power && ((borg.munchkin_mode & 1U) == 0)))) {
              dam_local = L'\xfffffc19';
            }
            else if ((borg.trait[0x69] == 0) && ((pbVar5->awake & 1U) == 0)) {
              dam_local = L'\0';
            }
            else {
              wVar4 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,false);
              if (pbVar5->power <= p1) {
                p1 = p1 << 1;
              }
              dam_local = p1 + wVar4;
            }
          }
        }
      }
      else {
        dam_local = L'\0';
      }
    }
  }
  else {
    dam_local = L'\0';
  }
  return dam_local;
}

Assistant:

static int borg_launch_bolt_aux_hack(int i, int dam, int typ, int ammo_location)
{
    int d, p2, p1, x, y;
    int o_y     = 0;
    int o_x     = 0;
    int walls   = 0;
    int unknown = 0;

    borg_grid *ag;

    borg_kill *kill;

    struct monster_race *r_ptr;

    /* Monster */
    kill = &borg_kills[i];

    /* monster race */
    r_ptr = &r_info[kill->r_idx];

    /* Skip dead monsters */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 0;

    /* Require current knowledge */
    if (kill->when < borg_t - 2)
        return 0;

    /* Acquire location */
    x = kill->pos.x;
    y = kill->pos.y;

    /* Acquire the grid */
    ag = &borg_grids[y][x];

    /* Never shoot walls/doors */
    if (!borg_cave_floor_grid(ag))
        return 0;

    /* dont shoot at ghosts if not on known floor grid */
    if ((rf_has(r_ptr->flags, RF_PASS_WALL))
        && (ag->feat != FEAT_FLOOR && ag->feat != FEAT_OPEN
            && ag->feat != FEAT_BROKEN && !ag->trap))
        return 0;

    /* dont shoot at ghosts in walls, not perfect */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        /* if 2 walls and 1 unknown skip this monster */
        /* Acquire location */
        x = kill->pos.x;
        y = kill->pos.y;

        /* Get grid */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x  = kill->pos.x + o_x;
                y  = kill->pos.y + o_y;

                ag = &borg_grids[y][x];

                if (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_PERM)
                    walls++;
                if (ag->feat == FEAT_NONE)
                    unknown++;
            }
        }
        /* Is the ghost likely in a wall? */
        if (walls >= 2 && unknown >= 1)
            return 0;
    }

    /* Calculate damage */
    d = borg_launch_damage_one(i, dam, typ, ammo_location);

    /* Return Damage, on Teleport Other, true damage is
     * calculated elsewhere */
    if (typ == BORG_ATTACK_AWAY_ALL || typ == BORG_ATTACK_AWAY_ALL_MORGOTH)
        return d;

    /* Return Damage as pure danger of the monster */
    if (typ == BORG_ATTACK_AWAY_EVIL)
        return d;

    /* Return 0 if the true damage (w/o the danger bonus) is 0 */
    if (d <= 0)
        return d;

    /* Calculate danger */
    p2 = borg_danger_one_kill(y, x, 1, i, true, false);

    /* Hack -- avoid waking most "hard" sleeping monsters */
    if (!kill->awake && (p2 > avoidance / 2) && (d < kill->power)
        && !borg.munchkin_mode) {
        return (-999);
    }

    /* Hack -- ignore sleeping town monsters */
    if (!borg.trait[BI_CDEPTH] && !kill->awake) {
        return 0;
    }

    /* Hack -- ignore nonthreatening town monsters when low level */
    if (!borg.trait[BI_CDEPTH] && borg.trait[BI_CLEVEL] < 3
        /* && monster_is_nonthreatening_test */) {
        /* Nothing yet */
    }

    /* Calculate "danger" to player */
    p1 = borg_danger_one_kill(borg.c.y, borg.c.x, 1, i, true, false);

    /* Extra "bonus" if attack kills */
    if (d >= kill->power)
        d = 2 * d;

    /* Add in dangers */
    d = d + p1;

    /* Result */
    return d;
}